

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O3

void __thiscall
ClearWrapperCommand::wrapperAction(ClearWrapperCommand *this,ExeElementWrapper *wrapper)

{
  bool bVar1;
  long *plVar2;
  
  if (wrapper != (ExeElementWrapper *)0x0) {
    bVar1 = AbstractByteBuffer::fillContent(&wrapper->super_AbstractByteBuffer,'\0');
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to fill...",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Filled!",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    if (wrapper->m_Exe != (Executable *)0x0) {
      plVar2 = (long *)__dynamic_cast(wrapper->m_Exe,&Executable::typeinfo,&MappedExe::typeinfo,0);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x100))(plVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

virtual void wrapperAction(ExeElementWrapper *wrapper)
    {
        if (wrapper == NULL) return;
        BYTE filling = 0;
        if (wrapper->fillContent(filling)) {
            std::cout << "Filled!" << std::endl;
        } else {
            std::cout << "Failed to fill..." << std::endl;
            return;
        }
        MappedExe *mExe = dynamic_cast<MappedExe*>(wrapper->getExe());
        if (mExe) {
            mExe->wrap();
        }
    }